

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall
hbm::streaming::Controller::Controller
          (Controller *this,string *streamId,string *address,string *port,string *path)

{
  ulong uVar1;
  runtime_error *this_00;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  HttpPost *unaff_retaddr;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)in_RSI);
  HttpPost::HttpPost(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"no stream id provided");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Controller::Controller(const std::string& streamId, const std::string& address, const std::string& port, const std::string& path)
			: m_streamId(streamId)
			, m_httpPost(address, port, path)
		{
			if(m_streamId.empty()) {
				throw std::runtime_error("no stream id provided");
			}
		}